

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_on_exchange(ptls_key_exchange_context_t *_ctx,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  EC_POINT *peer_point_00;
  int local_3c;
  int ret;
  EC_POINT *peer_point;
  st_x9_62_keyex_context_t *ctx;
  ptls_iovec_t *secret_local;
  ptls_key_exchange_context_t *_ctx_local;
  ptls_iovec_t peerkey_local;
  
  peer_point_00 =
       x9_62_decode_point((EC_GROUP *)_ctx[2].on_exchange,peerkey,(BN_CTX *)_ctx[1].on_exchange);
  if (peer_point_00 == (EC_POINT *)0x0) {
    local_3c = 0x32;
  }
  else {
    local_3c = ecdh_calc_secret(secret,(EC_GROUP *)_ctx[2].on_exchange,(EC_KEY *)_ctx[3].on_exchange
                                ,peer_point_00);
    EC_POINT_free((EC_POINT *)peer_point_00);
  }
  x9_62_free_context((st_x9_62_keyex_context_t *)_ctx);
  return local_3c;
}

Assistant:

static int x9_62_on_exchange(ptls_key_exchange_context_t *_ctx, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x9_62_keyex_context_t *ctx = (struct st_x9_62_keyex_context_t *)_ctx;
    EC_POINT *peer_point = NULL;
    int ret;

    if ((peer_point = x9_62_decode_point(ctx->group, peerkey, ctx->bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if ((ret = ecdh_calc_secret(secret, ctx->group, ctx->privkey, peer_point)) != 0)
        goto Exit;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    x9_62_free_context(ctx);
    return ret;
}